

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O2

void rnndec_freecontext(rnndeccontext *ctx)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < ctx->varsnum; lVar1 = lVar1 + 1) {
    free(ctx->vars[lVar1]);
  }
  free(ctx->vars);
  free(ctx);
  return;
}

Assistant:

void rnndec_freecontext(struct rnndeccontext *ctx) {
	int i;
	for (i = 0; i < ctx->varsnum; ++i)
		free(ctx->vars[i]);
	free(ctx->vars);
	free(ctx);
}